

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DynamicArrayType * __thiscall
slang::BumpAllocator::emplace<slang::ast::DynamicArrayType,slang::ast::Type_const&>
          (BumpAllocator *this,Type *args)

{
  DynamicArrayType *pDVar1;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pDVar1 = (DynamicArrayType *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::ast::DynamicArrayType::DynamicArrayType((DynamicArrayType *)this,args);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }